

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flute_mst.c
# Opt level: O2

void collect_nodes(TreeNode *tn,dl_t nlist)

{
  uint uVar1;
  dl_el *pdVar2;
  dl_el_s *pdVar3;
  dl_el_s *pdVar4;
  dl_el *pdVar5;
  dl_el_s *pdVar6;
  dl_el_s *pdVar7;
  dl_el **ppdVar8;
  
  pdVar6 = (dl_el_s *)malloc(0x18);
  if (pdVar6 == (dl_el_s *)0x0) {
    puts("Out of memory!!");
  }
  else {
    pdVar6[1].prev = (dl_el_s *)tn;
    pdVar6->next = (dl_el_s *)0x0;
    uVar1 = nlist->count;
    if (uVar1 == 0) {
      pdVar6->prev = (dl_el_s *)0x0;
      nlist->last = pdVar6;
      nlist->first = pdVar6;
      nlist->count = 1;
    }
    else {
      pdVar2 = nlist->last;
      pdVar6->prev = pdVar2;
      pdVar2->next = pdVar6;
      nlist->last = pdVar6;
      nlist->count = uVar1 + 1;
    }
  }
  ppdVar8 = &nlist->last;
  while (pdVar2 = *ppdVar8, pdVar2 != (dl_el *)0x0) {
    pdVar6 = (pdVar2[1].prev)->next->prev;
    while (pdVar6 != (dl_el_s *)0x0) {
      pdVar3 = pdVar6->next;
      pdVar4 = pdVar6[1].prev;
      pdVar7 = (dl_el_s *)malloc(0x18);
      pdVar6 = pdVar3;
      if (pdVar7 == (dl_el_s *)0x0) {
        puts("Out of memory!!");
      }
      else {
        pdVar7[1].prev = pdVar4;
        pdVar7->next = (dl_el_s *)0x0;
        uVar1 = nlist->count;
        if (uVar1 == 0) {
          pdVar7->prev = (dl_el_s *)0x0;
          nlist->last = pdVar7;
          nlist->first = pdVar7;
          nlist->count = 1;
        }
        else {
          pdVar5 = nlist->last;
          pdVar7->prev = pdVar5;
          pdVar5->next = pdVar7;
          nlist->last = pdVar7;
          nlist->count = uVar1 + 1;
        }
      }
    }
    ppdVar8 = &pdVar2->next;
  }
  return;
}

Assistant:

void collect_nodes(TreeNode* tn, dl_t nlist)
{
  /*
  TreeNode* c;
  
  dl_append(TreeNode*, nlist, tn);
  dl_forall(TreeNode*, tn->children, c) {
    collect_nodes(c, nlist);
  }dl_endfor;
  */
  // non-recursive version
  TreeNode* c;
  dl_el *curr;
  
  dl_append(TreeNode*, nlist, tn);

  for (curr=nlist->last; curr; curr=curr->next) {
    tn = dl_data(TreeNode*, curr);
    dl_forall(TreeNode*, tn->children, c) {
      dl_append(TreeNode*, nlist, c);
    }dl_endfor;
  }
}